

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

int __thiscall
QtPrivate::QGenericArrayOps<QDBusConnectionPrivate::ObjectTreeNode>::truncate
          (QGenericArrayOps<QDBusConnectionPrivate::ObjectTreeNode> *this,char *__file,
          __off_t __length)

{
  ObjectTreeNode *pOVar1;
  long lVar2;
  QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode> *this_00;
  
  pOVar1 = (ObjectTreeNode *)
           (this->super_QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>).size;
  if (pOVar1 != (ObjectTreeNode *)__file) {
    this_00 = &(this->super_QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>).ptr
               [(long)__file].children.d;
    lVar2 = (long)pOVar1 * 0x58 + (long)__file * -0x58;
    do {
      QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>::~QArrayDataPointer(this_00);
      pOVar1 = this_00[-2].ptr;
      if (pOVar1 != (ObjectTreeNode *)0x0) {
        LOCK();
        *(int *)&(pOVar1->name).d.d = *(int *)&(pOVar1->name).d.d + -1;
        UNLOCK();
        if (*(int *)&(pOVar1->name).d.d == 0) {
          QArrayData::deallocate((QArrayData *)this_00[-2].ptr,2,0x10);
        }
      }
      pOVar1 = this_00[-3].ptr;
      if (pOVar1 != (ObjectTreeNode *)0x0) {
        LOCK();
        *(int *)&(pOVar1->name).d.d = *(int *)&(pOVar1->name).d.d + -1;
        UNLOCK();
        if (*(int *)&(pOVar1->name).d.d == 0) {
          pOVar1 = (ObjectTreeNode *)QArrayData::deallocate((QArrayData *)this_00[-3].ptr,2,0x10);
        }
      }
      this_00 = (QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode> *)&this_00[3].size;
      lVar2 = lVar2 + -0x58;
    } while (lVar2 != 0);
  }
  (this->super_QArrayDataPointer<QDBusConnectionPrivate::ObjectTreeNode>).size = (qsizetype)__file;
  return (int)pOVar1;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }